

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const*&,char_const(&)[20],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
          (CompilerGLSL *this,char **t,char (*ts) [20],char **ts_1,char (*ts_2) [8],char **ts_3,
          char (*ts_4) [34])

{
  char **ts_local_3;
  char (*ts_local_2) [8];
  char **ts_local_1;
  char (*ts_local) [20];
  char **t_local;
  CompilerGLSL *this_local;
  
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[20],char_const*&,char_const(&)[8],char_const*&,char_const(&)[34]>
            (this,ts,ts_1,ts_2,ts_3,ts_4);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}